

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCollapsibleFrame.cpp
# Opt level: O2

void __thiscall QCollapsibleFrame::setTitleObjectName(QCollapsibleFrame *this,QString *name)

{
  QSlotObjectBase *pQVar1;
  anon_class_32_2_3fe36446_for_function local_60;
  anon_class_32_2_3fe36446_for_function local_40;
  
  local_60.name.d.d = (name->d).d;
  local_60.name.d.ptr = (name->d).ptr;
  local_60.name.d.size = (name->d).size;
  if (local_60.name.d.d != (Data *)0x0) {
    LOCK();
    ((local_60.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_60.this = this;
  pQVar1 = (QSlotObjectBase *)operator_new(0x30);
  setTitleObjectName(QString_const&)::$_0::__0((__0 *)&local_40,&local_60);
  (pQVar1->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  pQVar1->m_impl =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/pasnox[P]qtwidgetsextra/qtwidgetsextra/QtWidgetsExtra/Additional/QCollapsibleFrame.cpp:269:9),_0,_QtPrivate::List<>,_void>
       ::impl;
  setTitleObjectName(QString_const&)::$_0::__0((__0 *)(pQVar1 + 1),&local_40);
  QMetaObject::invokeMethodImpl((QObject *)this,pQVar1,QueuedConnection,(void *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40.name.d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60.name.d);
  return;
}

Assistant:

void QCollapsibleFrame::setTitleObjectName(const QString &name) {
    QMetaObject::invokeMethod(
        this,
        [this, name]() {
            if (titleObjectName() != name) {
                setTitle(findChild<QWidget *>(name));
            }
        },
        Qt::QueuedConnection);
}